

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

void __thiscall
discordpp::field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>::
field(field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_> *this,
     field<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_> *f)

{
  _Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
  __x;
  _Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
  this_00;
  
  __x._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
       .
       super__Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
       ._M_head_impl;
  if (__x._M_head_impl ==
      (vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)0x0) {
    (this->t_)._M_t.
    super___uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
    .
    super__Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
    ._M_head_impl = (vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)0x0;
    this_00._M_head_impl =
         (vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)0x0;
  }
  else {
    this_00._M_head_impl =
         (vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_> *)
         operator_new(0x18);
    std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>::vector
              (this_00._M_head_impl,__x._M_head_impl);
  }
  (this->t_)._M_t.
  super___uniq_ptr_impl<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_std::default_delete<std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_>_>
  .
  super__Head_base<0UL,_std::vector<discordpp::ChannelType,_std::allocator<discordpp::ChannelType>_>_*,_false>
  ._M_head_impl = this_00._M_head_impl;
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}